

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

MatchType __thiscall TileData::tryMatching(TileData *this,TileData *other)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  MatchType MVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  uint8_t i;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  
  auVar12[0] = -((other->_data)._M_elems[0] == (this->_data)._M_elems[0]);
  auVar12[1] = -((other->_data)._M_elems[1] == (this->_data)._M_elems[1]);
  auVar12[2] = -((other->_data)._M_elems[2] == (this->_data)._M_elems[2]);
  auVar12[3] = -((other->_data)._M_elems[3] == (this->_data)._M_elems[3]);
  auVar12[4] = -((other->_data)._M_elems[4] == (this->_data)._M_elems[4]);
  auVar12[5] = -((other->_data)._M_elems[5] == (this->_data)._M_elems[5]);
  auVar12[6] = -((other->_data)._M_elems[6] == (this->_data)._M_elems[6]);
  auVar12[7] = -((other->_data)._M_elems[7] == (this->_data)._M_elems[7]);
  auVar12[8] = -((other->_data)._M_elems[8] == (this->_data)._M_elems[8]);
  auVar12[9] = -((other->_data)._M_elems[9] == (this->_data)._M_elems[9]);
  auVar12[10] = -((other->_data)._M_elems[10] == (this->_data)._M_elems[10]);
  auVar12[0xb] = -((other->_data)._M_elems[0xb] == (this->_data)._M_elems[0xb]);
  auVar12[0xc] = -((other->_data)._M_elems[0xc] == (this->_data)._M_elems[0xc]);
  auVar12[0xd] = -((other->_data)._M_elems[0xd] == (this->_data)._M_elems[0xd]);
  auVar12[0xe] = -((other->_data)._M_elems[0xe] == (this->_data)._M_elems[0xe]);
  auVar12[0xf] = -((other->_data)._M_elems[0xf] == (this->_data)._M_elems[0xf]);
  if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf)
      == 0xffff) {
    MVar5 = EXACT;
  }
  else {
    if (options.allowMirroring) {
      if (flipTable._M_elems[(other->_data)._M_elems[0]] == (this->_data)._M_elems[0]) {
        lVar3 = 1;
        do {
          lVar7 = lVar3;
          if (lVar7 == 0x10) {
            return HFLIP;
          }
          lVar3 = lVar7 + 1;
        } while (flipTable._M_elems[(other->_data)._M_elems[lVar7]] == (this->_data)._M_elems[lVar7]
                );
        if (lVar7 == 0x10) {
          return HFLIP;
        }
      }
      bVar10 = true;
      uVar8 = 0xf;
      uVar9 = 0;
      bVar4 = true;
      bVar6 = true;
      do {
        bVar1 = (this->_data)._M_elems[uVar9];
        bVar2 = (other->_data)._M_elems[uVar8 ^ 1];
        if (bVar1 != bVar2) {
          bVar4 = false;
        }
        if (bVar1 != flipTable._M_elems[bVar2]) {
          bVar6 = false;
        }
        if ((!bVar4) && (bVar6 == false)) break;
        bVar10 = uVar9 < 0xf;
        uVar9 = uVar9 + 1;
        bVar11 = uVar8 != 0;
        uVar8 = uVar8 - 1;
      } while (bVar11);
      if (!bVar10) {
        if ((bVar4 == false) && (bVar6 == false)) {
          __assert_fail("hasVFlip || hasVHFlip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                        ,0x2f6,"tryMatching");
        }
        return VHFLIP - bVar4;
      }
    }
    MVar5 = NOPE;
  }
  return MVar5;
}

Assistant:

[[noreturn]] static void handleError(png_structp png, char const *msg) {
		Png *self = reinterpret_cast<Png *>(png_get_error_ptr(png));

		fatal("Error reading input image (\"%s\"): %s", self->string().c_str(), msg);
	}